

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O2

void __thiscall L14_3::Singer::set_data(Singer *this)

{
  std::operator<<((ostream *)&std::cout,"Enter number for singer\'s vocal range:\n");
}

Assistant:

void Singer::set_data() {
        std::cout << "Enter number for singer's vocal range:\n";
        //  output available vocals
        int i;
        for (i = 0; i < VoiceType; i++) {
            std::cout << i << ": " << pv[i] << " ";
            if (i % 4 == 3) {
                std::cout << std::endl;
            }
        }
        if (i % 4 != 0) {
            std::cout << std::endl;
        }
        //  只能输入 [0~VoiceType)范围内的数值
        while(std::cin >> _voice && (_voice < 0 || _voice >= VoiceType)) {
            std::cout << "Please enter a value in range [0, " << VoiceType << ");\n";
        }
        while(std::cin.get() != '\n') {
            continue;
        }
    }